

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupTrimmed2(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  Vec_Int_t *pVVar15;
  int iVar16;
  ulong uVar17;
  Gia_Obj_t *pGVar18;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  Gia_ManCreateRefs(p);
  pVVar15 = p->vCos;
  iVar7 = pVVar15->nSize;
  iVar16 = p->nRegs;
  if (iVar16 < iVar7) {
    lVar12 = 0;
    do {
      if (iVar7 <= lVar12) goto LAB_001e6f85;
      iVar7 = pVVar15->pArray[lVar12];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001e6f47;
      pGVar18 = p->pObjs;
      if (pGVar18 == (Gia_Obj_t *)0x0) break;
      pGVar10 = pGVar18 + iVar7 + -(ulong)((uint)*(undefined8 *)(pGVar18 + iVar7) & 0x1fffffff);
      if ((pGVar10 < pGVar18) || (pGVar18 + p->nObjs <= pGVar10)) goto LAB_001e6f66;
      p->pRefs[(int)((ulong)((long)pGVar10 - (long)pGVar18) >> 2) * -0x55555555] =
           p->pRefs[(int)((ulong)((long)pGVar10 - (long)pGVar18) >> 2) * -0x55555555] + -1;
      lVar12 = lVar12 + 1;
      iVar7 = pVVar15->nSize;
      iVar16 = p->nRegs;
    } while (lVar12 < iVar7 - iVar16);
  }
  uVar6 = p->vCis->nSize;
  uVar5 = uVar6 - iVar16;
  if (uVar5 == 0 || (int)uVar6 < iVar16) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    uVar17 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar17 = uVar13;
    }
    do {
      if (uVar17 == uVar13) goto LAB_001e6f85;
      iVar7 = p->vCis->pArray[uVar13];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001e6f47;
      if ((p->pObjs == (Gia_Obj_t *)0x0) || (p->pRefs[iVar7] != 0)) goto LAB_001e6ab4;
      uVar13 = uVar13 + 1;
    } while (uVar5 != uVar13);
    uVar13 = (ulong)uVar5;
  }
LAB_001e6ab4:
  if ((uint)uVar13 != uVar5) {
LAB_001e6b55:
    Gia_ManFillValue(p);
    p->pObjs->Value = 0;
    pVVar15 = p->vCis;
    uVar13 = (ulong)(uint)pVVar15->nSize;
    if (0 < pVVar15->nSize) {
      lVar12 = 0;
      do {
        lVar14 = (long)pVVar15->pArray[lVar12];
        if ((lVar14 < 0) || (p->nObjs <= pVVar15->pArray[lVar12])) goto LAB_001e6f47;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar18 = p->pObjs + lVar14;
        if ((p->pRefs[lVar14] != 0) ||
           ((uVar3 = *(undefined8 *)pGVar18, ((uint)uVar3 & 0x9fffffff) == 0x9fffffff &&
            ((int)uVar13 - p->nRegs <= (int)((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))))) {
          pGVar11 = Gia_ManAppendObj(p_00);
          uVar13 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar13 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar13 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar10 = p_00->pObjs;
          if ((pGVar11 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar11)) goto LAB_001e6f66;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555);
          pGVar10 = p_00->pObjs;
          if ((pGVar11 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar11)) goto LAB_001e6f66;
          pGVar18->Value = (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * 0x55555556;
        }
        lVar12 = lVar12 + 1;
        pVVar15 = p->vCis;
        uVar13 = (ulong)pVVar15->nSize;
      } while (lVar12 < (long)uVar13);
    }
    iVar7 = p->nObjs;
    if ((0 < iVar7) && (pGVar18 = p->pObjs, pGVar18 != (Gia_Obj_t *)0x0)) {
      lVar12 = 0;
      do {
        uVar13 = *(ulong *)pGVar18;
        if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
          if ((int)pGVar18[-(uVar13 & 0x1fffffff)].Value < 0) goto LAB_001e6fa4;
          uVar6 = (uint)(uVar13 >> 0x20);
          if ((int)pGVar18[-(ulong)(uVar6 & 0x1fffffff)].Value < 0) goto LAB_001e6fa4;
          uVar6 = Gia_ManAppendAnd(p_00,pGVar18[-(uVar13 & 0x1fffffff)].Value ^
                                        (uint)(uVar13 >> 0x1d) & 1,
                                   pGVar18[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1);
          pGVar18->Value = uVar6;
        }
        lVar12 = lVar12 + 1;
        iVar7 = p->nObjs;
      } while ((lVar12 < iVar7) && (pGVar18 = p->pObjs + lVar12, p->pObjs != (Gia_Obj_t *)0x0));
    }
    uVar6 = p->vCos->nSize;
    iVar16 = p->nRegs;
    uVar13 = 0;
    uVar5 = uVar6 - iVar16;
    if (uVar5 != 0 && iVar16 <= (int)uVar6) {
      uVar17 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar17 = uVar13;
      }
      do {
        if (uVar17 == uVar13) {
LAB_001e6f85:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCos->pArray[uVar13];
        if (((long)iVar1 < 0) || (iVar7 <= iVar1)) goto LAB_001e6f47;
        if ((p->pObjs == (Gia_Obj_t *)0x0) ||
           ((pGVar18 = p->pObjs + iVar1,
            uVar4 = *(ulong *)(pGVar18 + -(ulong)((uint)*(undefined8 *)pGVar18 & 0x1fffffff)),
            (~uVar4 & 0x1fffffff1fffffff) != 0 &&
            ((((uint)uVar4 & 0x9fffffff) != 0x9fffffff ||
             (p->vCis->nSize - iVar16 <= (int)((uint)(uVar4 >> 0x20) & 0x1fffffff)))))))
        goto LAB_001e6e18;
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
      uVar13 = (ulong)uVar5;
    }
LAB_001e6e18:
    if ((uint)uVar13 == uVar5) {
      Gia_ManAppendCo(p_00,0);
    }
    pVVar15 = p->vCos;
    uVar13 = (ulong)(uint)pVVar15->nSize;
    if (0 < pVVar15->nSize) {
      lVar12 = 0;
      do {
        iVar7 = pVVar15->pArray[lVar12];
        if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001e6f47:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar18 = p->pObjs + iVar7;
        uVar17 = *(ulong *)pGVar18;
        uVar6 = (uint)uVar17 & 0x1fffffff;
        uVar4 = *(ulong *)(pGVar18 + -(ulong)uVar6);
        if ((((~uVar4 & 0x1fffffff1fffffff) != 0) &&
            ((((uint)uVar4 & 0x9fffffff) != 0x9fffffff ||
             (p->vCis->nSize - p->nRegs <= (int)((uint)(uVar4 >> 0x20) & 0x1fffffff))))) ||
           ((uVar6 != 0x1fffffff && (int)(uint)uVar17 < 0 &&
            ((int)uVar13 - p->nRegs <= (int)((uint)(uVar17 >> 0x20) & 0x1fffffff))))) {
          if ((int)pGVar18[-(ulong)uVar6].Value < 0) {
LAB_001e6fa4:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(p_00,pGVar18[-(ulong)uVar6].Value ^ (uint)(uVar17 >> 0x1d) & 1);
        }
        lVar12 = lVar12 + 1;
        pVVar15 = p->vCos;
        uVar13 = (ulong)pVVar15->nSize;
      } while (lVar12 < (long)uVar13);
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
    iVar7 = Gia_ManHasDangling(p_00);
    if (iVar7 != 0) {
      __assert_fail("!Gia_ManHasDangling( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0x8f7,"Gia_Man_t *Gia_ManDupTrimmed2(Gia_Man_t *)");
    }
    return p_00;
  }
  pGVar10 = Gia_ManAppendObj(p_00);
  uVar13 = *(ulong *)pGVar10;
  *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
  *(ulong *)pGVar10 =
       uVar13 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar18 = p_00->pObjs;
  if ((pGVar18 <= pGVar10) && (pGVar10 < pGVar18 + p_00->nObjs)) {
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar18) >> 2) * -0x55555555);
    if ((p_00->pObjs <= pGVar10) && (pGVar10 < p_00->pObjs + p_00->nObjs)) goto LAB_001e6b55;
  }
LAB_001e6f66:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed2( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    // discount references of POs
    Gia_ManForEachPo( p, pObj, i )
        Gia_ObjRefFanin0Dec( p, pObj );
    // check if PIs are left
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // check if there are POs to be added
    Gia_ManForEachPo( p, pObj, i )
        if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj)) )
            break;
    if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
        Gia_ManAppendCo( pNew, 0 );
    Gia_ManForEachCo( p, pObj, i )
        if ( (!Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj))) || Gia_ObjIsRi(p, pObj) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}